

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

void __thiscall
testing::internal::FunctionMockerBase<TestResult_(mp::LogicalCountExpr)>::PerformDefaultAction
          (FunctionMockerBase<TestResult_(mp::LogicalCountExpr)> *this,ArgumentTuple *args,
          string *call_description)

{
  OnCallSpec<TestResult_(mp::LogicalCountExpr)> *this_00;
  Action<TestResult_(mp::LogicalCountExpr)> *this_01;
  runtime_error *this_02;
  string message;
  
  this_00 = FindOnCallSpec(this,args);
  if (this_00 != (OnCallSpec<TestResult_(mp::LogicalCountExpr)> *)0x0) {
    this_01 = OnCallSpec<TestResult_(mp::LogicalCountExpr)>::GetAction(this_00);
    Action<TestResult_(mp::LogicalCountExpr)>::Perform(this_01,args);
    return;
  }
  std::operator+(&message,call_description,
                 "\n    The mock function has no default action set, and its return type has no default value set."
                );
  if (DefaultValue<TestResult>::value_ != 0) {
    DefaultValue<TestResult>::Get();
    std::__cxx11::string::~string((string *)&message);
    return;
  }
  this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_02,(string *)&message);
  __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Result PerformDefaultAction(const ArgumentTuple& args,
                              const string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != NULL) {
      return spec->GetAction().Perform(args);
    }
    const string message = call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }